

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectdefs_impl.h
# Opt level: O0

void QtPrivate::assertObjectType<QFbVtHandler>(QObject *o)

{
  long in_FS_OFFSET;
  anon_class_1_0_00000001 cast;
  anon_class_1_0_00000001 dyncast;
  anon_class_1_0_00000001 qobjcast;
  anon_class_1_0_00000001 staticcast;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void assertObjectType(QObject *o)
    {
        // ensure all three compile
        [[maybe_unused]] auto staticcast = [](QObject *obj) { return static_cast<Obj *>(obj); };
        [[maybe_unused]] auto qobjcast = [](QObject *obj) { return Obj::staticMetaObject.cast(obj); };
#ifdef __cpp_rtti
        [[maybe_unused]] auto dyncast = [](QObject *obj) { return dynamic_cast<Obj *>(obj); };
        auto cast = dyncast;
#else
        auto cast = qobjcast;
#endif
        Q_ASSERT_X(cast(o), Obj::staticMetaObject.className(),
                   "Called object is not of the correct type (class destructor may have already run)");
    }